

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall Widget::Widget(Widget *this)

{
  this->_vptr_Widget = (_func_int **)&PTR__Widget_0010c6c8;
  this->grid_x = 0;
  this->grid_y = 0;
  this->grid_w = 0;
  this->grid_h = 0;
  this->dialog = (Dialog *)0x0;
  this->x1 = 0;
  this->y1 = 0;
  *(undefined8 *)((long)&this->x1 + 1) = 0;
  *(undefined8 *)((long)&this->x2 + 1) = 0;
  return;
}

Assistant:

Widget::Widget():
   grid_x(0),
   grid_y(0),
   grid_w(0),
   grid_h(0),
   dialog(NULL),
   x1(0),
   y1(0),
   x2(0),
   y2(0),
   disabled(false)
{
}